

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.h
# Opt level: O1

void __thiscall
jbcoin::STPathElement::STPathElement
          (STPathElement *this,AccountID *account,Currency *currency,AccountID *issuer,
          bool forceCurrency)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  
  this->mType = 0;
  (this->mAccountID).pn[4] = account->pn[4];
  uVar1 = *(undefined8 *)(account->pn + 2);
  *(undefined8 *)(this->mAccountID).pn = *(undefined8 *)account->pn;
  *(undefined8 *)((this->mAccountID).pn + 2) = uVar1;
  uVar1 = *(undefined8 *)(currency->pn + 2);
  *(undefined8 *)(this->mCurrencyID).pn = *(undefined8 *)currency->pn;
  *(undefined8 *)((this->mCurrencyID).pn + 2) = uVar1;
  (this->mCurrencyID).pn[4] = currency->pn[4];
  (this->mIssuerID).pn[4] = issuer->pn[4];
  uVar1 = *(undefined8 *)(issuer->pn + 2);
  *(undefined8 *)(this->mIssuerID).pn = *(undefined8 *)issuer->pn;
  *(undefined8 *)((this->mIssuerID).pn + 2) = uVar1;
  if ((this->mAccountID).pn[0] == 0) {
    uVar3 = 0xffffffffffffffff;
    do {
      if (uVar3 == 3) {
        uVar5 = 4;
        break;
      }
      uVar5 = uVar3 + 1;
      lVar2 = uVar3 + 2;
      uVar3 = uVar5;
    } while ((this->mAccountID).pn[lVar2] == 0);
    this->is_offer_ = 3 < uVar5;
    if (3 >= uVar5) goto LAB_001ee195;
  }
  else {
    this->is_offer_ = false;
LAB_001ee195:
    this->mType = 1;
  }
  if ((forceCurrency) || (currency->pn[0] != 0)) {
LAB_001ee1cd:
    *(byte *)&this->mType = (byte)this->mType | 0x10;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    do {
      if (uVar3 == 3) {
        uVar5 = 4;
        break;
      }
      uVar5 = uVar3 + 1;
      lVar2 = uVar3 + 2;
      uVar3 = uVar5;
    } while (currency->pn[lVar2] == 0);
    if (uVar5 < 4) goto LAB_001ee1cd;
  }
  if (issuer->pn[0] == 0) {
    uVar3 = 0xffffffffffffffff;
    do {
      if (uVar3 == 3) {
        uVar5 = 4;
        break;
      }
      uVar5 = uVar3 + 1;
      lVar2 = uVar3 + 2;
      uVar3 = uVar5;
    } while (issuer->pn[lVar2] == 0);
    if (3 < uVar5) goto LAB_001ee200;
  }
  *(byte *)&this->mType = (byte)this->mType | 0x20;
LAB_001ee200:
  sVar4 = get_hash(this);
  this->hash_value_ = sVar4;
  return;
}

Assistant:

STPathElement (
        AccountID const& account, Currency const& currency,
        AccountID const& issuer, bool forceCurrency = false)
        : mType (typeNone), mAccountID (account), mCurrencyID (currency)
        , mIssuerID (issuer), is_offer_ (isXRP(mAccountID))
    {
        if (!is_offer_)
            mType |= typeAccount;

        if (forceCurrency || !isXRP(currency))
            mType |= typeCurrency;

        if (!isXRP(issuer))
            mType |= typeIssuer;

        hash_value_ = get_hash (*this);
    }